

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O1

void __thiscall duckdb::SQLLogicTestRunner::~SQLLogicTestRunner(SQLLogicTestRunner *this)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pcVar3;
  _Head_base<0UL,_duckdb::Command_*,_false> _Var4;
  pointer ppLVar5;
  char cVar6;
  pointer pbVar7;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this->_vptr_SQLLogicTestRunner = (_func_int **)&PTR_LoadDatabase_005dbdc0;
  std::__uniq_ptr_impl<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_>::reset
            ((__uniq_ptr_impl<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_> *)
             &this->config,(pointer)0x0);
  std::__uniq_ptr_impl<duckdb::Connection,_std::default_delete<duckdb::Connection>_>::reset
            ((__uniq_ptr_impl<duckdb::Connection,_std::default_delete<duckdb::Connection>_> *)
             &this->con,(pointer)0x0);
  std::__uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>::reset
            ((__uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_> *)&this->db,
             (pointer)0x0);
  pbVar7 = (this->loaded_databases).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->loaded_databases).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 != pbVar1) {
    do {
      if (pbVar7->_M_string_length != 0) {
        local_70[0] = local_60;
        pcVar2 = (pbVar7->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,pcVar2,pcVar2 + pbVar7->_M_string_length);
        TestDirectoryPath_abi_cxx11_();
        cVar6 = duckdb::StringUtil::StartsWith((string *)local_70,local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0]);
        }
        if (cVar6 != '\0') {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          pcVar2 = (pbVar7->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar2,pcVar2 + pbVar7->_M_string_length);
          DeleteDatabase(&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
        }
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->result_label_map)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->hash_label_map)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->always_fail_error_messages)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->ignore_error_messages)._M_h);
  pcVar3 = (this->local_extension_repo)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->local_extension_repo).field_2) {
    operator_delete(pcVar3);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->environment_variables)._M_h);
  _Var4._M_head_impl =
       (this->top_level_loop).
       super_unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>_>._M_t.
       super___uniq_ptr_impl<duckdb::Command,_std::default_delete<duckdb::Command>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Command_*,_std::default_delete<duckdb::Command>_>.
       super__Head_base<0UL,_duckdb::Command_*,_false>._M_head_impl;
  if (_Var4._M_head_impl != (Command *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_Command + 8))();
  }
  (this->top_level_loop).super_unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>_>.
  _M_t.super___uniq_ptr_impl<duckdb::Command,_std::default_delete<duckdb::Command>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Command_*,_std::default_delete<duckdb::Command>_>.
  super__Head_base<0UL,_duckdb::Command_*,_false>._M_head_impl = (Command *)0x0;
  ppLVar5 = (this->active_loops).
            super_vector<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>.
            super__Vector_base<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppLVar5 != (pointer)0x0) {
    operator_delete(ppLVar5);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->named_connection_map)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->extensions)._M_h);
  std::unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_>::~unique_ptr
            (&(this->config).
              super_unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_>);
  std::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>_>::~unique_ptr
            (&(this->con).
              super_unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>_>);
  std::unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>::~unique_ptr
            (&(this->db).super_unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>);
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&this->loaded_databases);
  pcVar3 = (this->dbpath)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->dbpath).field_2) {
    operator_delete(pcVar3);
  }
  return;
}

Assistant:

SQLLogicTestRunner::~SQLLogicTestRunner() {
	config.reset();
	con.reset();
	db.reset();
	for (auto &loaded_path : loaded_databases) {
		if (loaded_path.empty()) {
			continue;
		}
		// only delete database files that were created during the tests
		if (!StringUtil::StartsWith(loaded_path, TestDirectoryPath())) {
			continue;
		}
		DeleteDatabase(loaded_path);
	}
}